

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

appender fmt::v9::detail::
         do_write_float<fmt::v9::appender,fmt::v9::detail::big_decimal_fp,char,fmt::v9::detail::digit_grouping<char>>
                   (appender out,big_decimal_fp *f,basic_format_specs<char> *specs,
                   float_specs fspecs,locale_ref loc)

{
  char cVar1;
  long lVar2;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> bVar3;
  appender aVar4;
  int iVar5;
  size_t sVar6;
  char *pcVar7;
  int iVar8;
  uint uVar9;
  float_specs fVar10;
  uint uVar11;
  ulong uVar12;
  float_specs fVar13;
  char *pcVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  ulong uVar18;
  char decimal_point;
  sign_t sign;
  char zero;
  bool pointy;
  int significand_size;
  char *significand;
  int exp;
  digit_grouping<char> grouping;
  anon_class_40_8_dbbf3351 write;
  undefined1 local_e3 [27];
  float_specs local_c8;
  undefined1 local_bc [8];
  int iStack_b4;
  long local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  char local_98;
  anon_class_72_9_0c6a3a8a local_90;
  ulong local_48;
  float_specs local_40;
  _Alloc_hider local_38;
  
  local_c8 = (float_specs)f->significand;
  iVar5 = f->significand_size;
  local_e3[2] = 0x30;
  local_e3[1] = fspecs._5_1_;
  local_e3._7_4_ = iVar5;
  local_38._M_p = (pointer)fspecs;
  if (iVar5 < 0) {
LAB_002327ee:
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O3/_deps/fmt-src/include/fmt/core.h"
                ,0x199,"negative value");
  }
  fVar13.precision = (iVar5 + 1) - (uint)(local_e3[1] == '\0');
  fVar13._4_4_ = 0;
  local_e3[0] = '.';
  uVar11 = fspecs._4_4_;
  fVar10 = fspecs;
  local_90.significand = (char **)local_c8;
  uVar12 = (ulong)fspecs >> 0x28;
  if ((uVar11 >> 0x11 & 1) != 0) {
    local_e3._11_8_ = out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
    local_e3._19_8_ = fspecs;
    local_48 = (ulong)fspecs >> 0x28;
    local_40 = local_c8;
    local_e3[0] = decimal_point_impl<char>(loc);
    fVar10 = (float_specs)local_e3._19_8_;
    out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container =
         (back_insert_iterator<fmt::v9::detail::buffer<char>_>)
         (back_insert_iterator<fmt::v9::detail::buffer<char>_>)local_e3._11_8_;
    local_90.significand = (char **)local_40;
    uVar12 = local_48;
  }
  uVar9 = f->exponent;
  iVar15 = iVar5 + uVar9;
  iVar8 = fVar10.precision;
  if (fspecs._4_1_ == '\x01') {
LAB_00232490:
    iVar16 = iVar5 + uVar9 + -1;
    if ((uVar11 >> 0x13 & 1) == 0) {
      uVar18 = 0;
      if (iVar5 == 1) {
        local_e3[0] = '\0';
        uVar18 = 0;
      }
    }
    else {
      uVar18 = 0;
      if (0 < iVar8 - iVar5) {
        uVar18 = (ulong)(uint)(iVar8 - iVar5);
      }
      fVar13 = (float_specs)((long)fVar13 + uVar18);
    }
    local_90.sign = (sign_t *)CONCAT71(local_90.sign._1_7_,(char)uVar12);
    local_90.significand_size._0_5_ = CONCAT14(local_e3[0],iVar5);
    local_90.f._0_5_ = CONCAT14(0x30,(int)uVar18);
    local_90.f = (big_decimal_fp *)
                 (CONCAT26(local_90.f._6_2_,
                           CONCAT15(((uVar11 >> 0x10 & 1) == 0) << 5,local_90.f._0_5_)) |
                 0x450000000000);
    local_90.grouping = (digit_grouping<char> *)CONCAT44(local_90.grouping._4_4_,iVar16);
    if (0 < specs->width) {
      if (iVar15 < 1) {
        iVar16 = 1 - iVar15;
      }
      lVar17 = 2;
      if (99 < iVar16) {
        lVar17 = (ulong)(999 < iVar16) + 3;
      }
      sVar6 = (long)fVar13 + (3 - (ulong)(local_e3[0] == '\0')) + lVar17;
      aVar4 = write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::do_write_float<fmt::v9::appender,fmt::v9::detail::big_decimal_fp,char,fmt::v9::detail::digit_grouping<char>>(fmt::v9::appender,fmt::v9::detail::big_decimal_fp_const&,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::float_specs,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_1_&>
                        (out,specs,sVar6,sVar6,(anon_class_40_8_dbbf3351 *)&local_90);
      return (back_insert_iterator<fmt::v9::detail::buffer<char>_>)
             aVar4.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
    }
    cVar1 = local_e3[0];
    iVar8 = (int)uVar18;
    if ((char)uVar12 != '\0') {
      cVar1 = ""[uVar12 & 0xff];
      sVar6 = ((buffer<char> *)
              out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container)->size_;
      uVar12 = sVar6 + 1;
      if (((buffer<char> *)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container)
          ->capacity_ < uVar12) {
        (**((buffer<char> *)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container
           )->_vptr_buffer)();
        sVar6 = ((buffer<char> *)
                out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container)->size_;
        uVar12 = sVar6 + 1;
      }
      ((buffer<char> *)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container)->
      size_ = uVar12;
      ((buffer<char> *)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container)->
      ptr_[sVar6] = cVar1;
      cVar1 = local_90.significand_size._4_1_;
      iVar5 = (int)local_90.significand_size;
      iVar8 = (int)local_90.f;
    }
    bVar3.container =
         (buffer<char> *)
         write_significand<fmt::v9::appender,char>(out,(char *)local_90.significand,iVar5,1,cVar1);
    if (0 < iVar8) {
      bVar3.container =
           (buffer<char> *)
           fill_n<fmt::v9::appender,int,char>
                     ((appender)bVar3.container,iVar8,(char *)((long)&local_90.f + 4));
    }
    cVar1 = local_90.f._5_1_;
    sVar6 = (bVar3.container)->size_;
    uVar12 = sVar6 + 1;
    if ((bVar3.container)->capacity_ < uVar12) {
      (**(bVar3.container)->_vptr_buffer)(bVar3.container);
      sVar6 = (bVar3.container)->size_;
      uVar12 = sVar6 + 1;
    }
    (bVar3.container)->size_ = uVar12;
    (bVar3.container)->ptr_[sVar6] = cVar1;
    aVar4 = write_exponent<char,fmt::v9::appender>((int)local_90.grouping,(appender)bVar3.container)
    ;
    return (back_insert_iterator<fmt::v9::detail::buffer<char>_>)
           aVar4.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
  }
  if (((ulong)fspecs & 0xff00000000) == 0) {
    iVar16 = 0x10;
    if (0 < iVar8) {
      iVar16 = iVar8;
    }
    if ((iVar15 < -3) || (iVar16 < iVar15)) goto LAB_00232490;
  }
  local_bc._0_4_ = iVar15;
  if ((int)uVar9 < 0) {
    if (iVar15 < 1) {
      iVar16 = -iVar15;
      local_bc._4_4_ = iVar16;
      if (SBORROW4(iVar8,iVar16) != iVar8 + iVar15 < 0) {
        local_bc._4_4_ = iVar8;
      }
      if (iVar8 < 0) {
        local_bc._4_4_ = iVar16;
      }
      if (iVar5 != 0) {
        local_bc._4_4_ = iVar16;
      }
      if (iVar5 == 0 && local_bc._4_4_ == 0) {
        local_e3[3] = (char)((uVar11 & 0x80000) >> 0x13);
        iVar5 = 2 - (uint)(((ulong)fspecs & 0x8000000000000) == 0);
      }
      else {
        local_e3[3] = 1;
        iVar5 = 2;
        if ((int)local_bc._4_4_ < 0) goto LAB_002327ee;
      }
      sVar6 = (ulong)(uint)(iVar5 + local_bc._4_4_) + (long)fVar13;
      local_90.sign = local_e3 + 1;
      local_90.significand = (char **)(local_e3 + 2);
      local_90.significand_size = (int *)(local_e3 + 3);
      local_90.f = (big_decimal_fp *)local_e3;
      local_90.grouping = (digit_grouping<char> *)(local_bc + 4);
      local_90.fspecs = &local_c8;
      local_90.decimal_point = local_e3 + 7;
      aVar4 = write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::do_write_float<fmt::v9::appender,fmt::v9::detail::big_decimal_fp,char,fmt::v9::detail::digit_grouping<char>>(fmt::v9::appender,fmt::v9::detail::big_decimal_fp_const&,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::float_specs,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_4_&>
                        (out,specs,sVar6,sVar6,(anon_class_56_7_162c6e41 *)&local_90);
      return (back_insert_iterator<fmt::v9::detail::buffer<char>_>)
             aVar4.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
    }
    iVar15 = 0;
    local_e3._3_4_ = iVar8 - iVar5 & (int)(uVar11 << 0xc) >> 0x1f;
    uVar9 = local_e3._3_4_;
    if ((int)local_e3._3_4_ < 1) {
      uVar9 = 0;
    }
    local_e3._19_8_ = fVar13;
    digit_grouping<char>::digit_grouping
              ((digit_grouping<char> *)(local_bc + 4),loc,(bool)((byte)(uVar11 >> 0x11) & 1));
    if (local_98 != '\0') {
      pcVar14 = (char *)CONCAT44(iStack_b4,local_bc._4_4_);
      pcVar7 = pcVar14 + local_b0;
      lVar17 = 0;
      do {
        if (pcVar14 == pcVar7) {
          cVar1 = pcVar7[-1];
          pcVar14 = pcVar7;
        }
        else {
          cVar1 = *pcVar14;
          if ((byte)(cVar1 + 0x81U) < 0x82) goto LAB_0023280e;
          pcVar14 = pcVar14 + 1;
        }
        iVar15 = iVar15 + cVar1;
        if ((int)local_e3._7_4_ <= iVar15) goto LAB_0023280e;
        lVar17 = lVar17 + 1;
      } while( true );
    }
    lVar17 = 0;
LAB_0023280e:
    sVar6 = (ulong)uVar9 + local_e3._19_8_ + lVar17 + 1;
    local_90.sign = local_e3 + 1;
    local_90.significand = (char **)&local_c8;
    local_90.significand_size = (int *)(local_e3 + 7);
    local_90.f = (big_decimal_fp *)local_bc;
    local_90.grouping = (digit_grouping<char> *)local_e3;
    local_90.decimal_point = local_e3 + 3;
    local_90.num_zeros = (int *)(local_e3 + 2);
    local_90.fspecs = (float_specs *)(local_bc + 4);
    bVar3.container =
         (buffer<char> *)
         write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::do_write_float<fmt::v9::appender,fmt::v9::detail::big_decimal_fp,char,fmt::v9::detail::digit_grouping<char>>(fmt::v9::appender,fmt::v9::detail::big_decimal_fp_const&,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::float_specs,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_3_&>
                   (out,specs,sVar6,sVar6,(anon_class_64_8_e6ffa566 *)&local_90);
    goto LAB_0023286a;
  }
  lVar17 = (ulong)uVar9 + (long)fVar13;
  local_e3._3_4_ = iVar8 - iVar15;
  if ((uVar11 >> 0x13 & 1) != 0) {
    lVar17 = lVar17 + 1;
    if (fspecs._4_1_ == '\x02' || 0 < (int)local_e3._3_4_) {
      if ((int)local_e3._3_4_ < 1) goto LAB_002326df;
    }
    else {
      local_e3._3_4_ = 1;
    }
    lVar17 = lVar17 + (ulong)(uint)local_e3._3_4_;
  }
LAB_002326df:
  local_e3._11_8_ = out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
  digit_grouping<char>::digit_grouping
            ((digit_grouping<char> *)(local_bc + 4),loc,(bool)((byte)(uVar11 >> 0x11) & 1));
  iVar5 = 0;
  if (local_98 != '\0') {
    pcVar14 = (char *)CONCAT44(iStack_b4,local_bc._4_4_);
    pcVar7 = pcVar14 + local_b0;
    lVar2 = 0;
    do {
      if (pcVar14 == pcVar7) {
        cVar1 = pcVar7[-1];
        pcVar14 = pcVar7;
      }
      else {
        cVar1 = *pcVar14;
        if ((byte)(cVar1 + 0x81U) < 0x82) goto LAB_00232750;
        pcVar14 = pcVar14 + 1;
      }
      iVar5 = iVar5 + cVar1;
      if (iVar15 <= iVar5) goto LAB_00232750;
      lVar2 = lVar2 + 1;
    } while( true );
  }
  lVar2 = 0;
LAB_00232750:
  local_90.sign = local_e3 + 1;
  local_90.significand = (char **)&local_c8;
  local_90.significand_size = (int *)(local_e3 + 7);
  local_90.fspecs = (float_specs *)&local_38;
  local_90.decimal_point = local_e3;
  local_90.num_zeros = (int *)(local_e3 + 3);
  local_90.zero = local_e3 + 2;
  local_90.f = f;
  local_90.grouping = (digit_grouping<char> *)(local_bc + 4);
  bVar3.container =
       (buffer<char> *)
       write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::do_write_float<fmt::v9::appender,fmt::v9::detail::big_decimal_fp,char,fmt::v9::detail::digit_grouping<char>>(fmt::v9::appender,fmt::v9::detail::big_decimal_fp_const&,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::float_specs,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_2_&>
                 ((appender)local_e3._11_8_,specs,lVar17 + lVar2,lVar17 + lVar2,&local_90);
LAB_0023286a:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(iStack_b4,local_bc._4_4_) != &local_a8) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(iStack_b4,local_bc._4_4_),local_a8._M_allocated_capacity + 1);
  }
  return (appender)(back_insert_iterator<fmt::v9::detail::buffer<char>_>)bVar3.container;
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& f,
                                    const basic_format_specs<Char>& specs,
                                    float_specs fspecs, locale_ref loc)
    -> OutputIt {
  auto significand = f.significand;
  int significand_size = get_significand_size(f);
  const Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point =
      fspecs.locale ? detail::decimal_point<Char>(loc) : static_cast<Char>('.');

  int output_exp = f.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = fspecs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = f.exponent + significand_size;
  if (f.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(f.exponent);
    int num_zeros = fspecs.precision - exp;
    abort_fuzzing_if(num_zeros > 5000);
    if (fspecs.showpoint) {
      ++size;
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand<Char>(it, significand, significand_size,
                                   f.exponent, grouping);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(significand_size));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || fspecs.showpoint;
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = detail::sign<Char>(sign);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}